

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::BeginColumns(char *str_id,int columns_count,ImGuiColumnsFlags flags)

{
  float fVar1;
  ImVec2 IVar2;
  int iVar3;
  ImGuiWindow *window;
  ImGuiColumnData *pIVar4;
  ImGuiColumns *pIVar5;
  undefined1 auVar6 [16];
  ImGuiContext *pIVar7;
  ImGuiID id;
  ImGuiColumns *pIVar8;
  ImGuiColumnData *pIVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ImGuiContext *g;
  ulong uVar15;
  bool bVar16;
  uint uVar17;
  uint uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  
  pIVar7 = GImGui;
  window = GImGui->CurrentWindow;
  window->WriteAccessed = true;
  id = GetColumnsID(str_id,columns_count);
  pIVar8 = FindOrCreateColumns(window,id);
  pIVar8->Current = 0;
  pIVar8->Count = columns_count;
  pIVar8->Flags = flags;
  (window->DC).CurrentColumns = pIVar8;
  pIVar8->HostCursorPosY = (window->DC).CursorPos.y;
  pIVar8->HostCursorMaxPosX = (window->DC).CursorMaxPos.x;
  IVar2 = (window->ClipRect).Max;
  (pIVar8->HostClipRect).Min = (window->ClipRect).Min;
  (pIVar8->HostClipRect).Max = IVar2;
  IVar2 = (window->WorkRect).Max;
  (pIVar8->HostWorkRect).Min = (window->WorkRect).Min;
  (pIVar8->HostWorkRect).Max = IVar2;
  fVar1 = (pIVar7->Style).ItemSpacing.x;
  fVar19 = (window->WindowPadding).x;
  fVar21 = fVar1 - fVar19;
  fVar19 = fVar19 * 0.5;
  uVar17 = -(uint)(window->WindowBorderSize <= fVar19);
  fVar20 = (window->WorkRect).Max.x;
  fVar21 = (float)(-(uint)(0.0 <= fVar21) & (uint)fVar21);
  fVar22 = (fVar1 + fVar20) - fVar21;
  fVar20 = (float)(int)(float)(~uVar17 & (uint)window->WindowBorderSize | (uint)fVar19 & uVar17) +
           fVar20;
  if (fVar20 <= fVar22) {
    fVar22 = fVar20;
  }
  fVar21 = ((window->DC).Indent.x - fVar1) + fVar21;
  pIVar8->OffMinX = fVar21;
  fVar22 = fVar22 - (window->Pos).x;
  fVar21 = fVar21 + 1.0;
  uVar17 = -(uint)(fVar21 <= fVar22);
  pIVar8->OffMaxX = (float)(~uVar17 & (uint)fVar21 | (uint)fVar22 & uVar17);
  fVar19 = (window->DC).CursorPos.y;
  pIVar8->LineMaxY = fVar19;
  pIVar8->LineMinY = fVar19;
  iVar14 = (pIVar8->Columns).Size;
  iVar12 = columns_count + 1;
  if (iVar14 != iVar12 && iVar14 != 0) {
    iVar14 = (pIVar8->Columns).Capacity;
    if (iVar14 < 0) {
      uVar17 = iVar14 / 2 + iVar14;
      uVar15 = 0;
      if (0 < (int)uVar17) {
        uVar15 = (ulong)uVar17;
      }
      pIVar9 = (ImGuiColumnData *)MemAlloc(uVar15 * 0x1c);
      pIVar4 = (pIVar8->Columns).Data;
      if (pIVar4 != (ImGuiColumnData *)0x0) {
        memcpy(pIVar9,pIVar4,(long)(pIVar8->Columns).Size * 0x1c);
        MemFree((pIVar8->Columns).Data);
      }
      (pIVar8->Columns).Data = pIVar9;
      (pIVar8->Columns).Capacity = (int)uVar15;
    }
    (pIVar8->Columns).Size = 0;
  }
  bVar16 = (pIVar8->Columns).Size == 0;
  pIVar8->IsFirstFrame = bVar16;
  if (bVar16) {
    if ((pIVar8->Columns).Capacity <= columns_count) {
      pIVar9 = (ImGuiColumnData *)MemAlloc((long)iVar12 * 0x1c);
      pIVar4 = (pIVar8->Columns).Data;
      if (pIVar4 != (ImGuiColumnData *)0x0) {
        memcpy(pIVar9,pIVar4,(long)(pIVar8->Columns).Size * 0x1c);
        MemFree((pIVar8->Columns).Data);
      }
      (pIVar8->Columns).Data = pIVar9;
      (pIVar8->Columns).Capacity = iVar12;
    }
    if (-1 < columns_count) {
      iVar14 = 0;
      do {
        iVar13 = (pIVar8->Columns).Size;
        iVar3 = (pIVar8->Columns).Capacity;
        if (iVar13 == iVar3) {
          if (iVar3 == 0) {
            iVar10 = 8;
          }
          else {
            iVar10 = iVar3 / 2 + iVar3;
          }
          iVar13 = iVar13 + 1;
          if (iVar13 < iVar10) {
            iVar13 = iVar10;
          }
          if (iVar3 < iVar13) {
            pIVar9 = (ImGuiColumnData *)MemAlloc((long)iVar13 * 0x1c);
            pIVar4 = (pIVar8->Columns).Data;
            if (pIVar4 != (ImGuiColumnData *)0x0) {
              memcpy(pIVar9,pIVar4,(long)(pIVar8->Columns).Size * 0x1c);
              MemFree((pIVar8->Columns).Data);
            }
            (pIVar8->Columns).Data = pIVar9;
            (pIVar8->Columns).Capacity = iVar13;
          }
        }
        pIVar4 = (pIVar8->Columns).Data;
        iVar13 = (pIVar8->Columns).Size;
        pIVar4[iVar13].OffsetNorm = (float)iVar14 / (float)columns_count;
        pIVar9 = pIVar4 + iVar13;
        pIVar9->OffsetNormBeforeResize = 0.0;
        pIVar9->Flags = 0;
        (((ImRect *)(&pIVar9->OffsetNormBeforeResize + 2))->Min).x = 0.0;
        (((ImRect *)(&pIVar9->OffsetNormBeforeResize + 2))->Min).y = 0.0;
        pIVar4[iVar13].ClipRect.Max.x = 0.0;
        pIVar4[iVar13].ClipRect.Max.y = 0.0;
        (pIVar8->Columns).Size = (pIVar8->Columns).Size + 1;
        iVar14 = iVar14 + 1;
      } while (iVar12 != iVar14);
    }
  }
  auVar6 = _DAT_00220bf0;
  if (0 < columns_count) {
    lVar11 = 0;
    do {
      pIVar5 = (GImGui->CurrentWindow->DC).CurrentColumns;
      fVar19 = 0.0;
      fVar20 = 0.0;
      if (pIVar5 != (ImGuiColumns *)0x0) {
        fVar20 = (pIVar5->OffMaxX - pIVar5->OffMinX) *
                 *(float *)((long)&((pIVar5->Columns).Data)->OffsetNorm + lVar11) + pIVar5->OffMinX;
      }
      fVar22 = (window->Pos).x;
      if (pIVar5 != (ImGuiColumns *)0x0) {
        fVar19 = (pIVar5->OffMaxX - pIVar5->OffMinX) *
                 *(float *)((long)&(pIVar5->Columns).Data[1].OffsetNorm + lVar11) + pIVar5->OffMinX;
      }
      pIVar4 = (pIVar8->Columns).Data;
      fVar20 = (float)(int)(fVar20 + fVar22 + 0.5);
      fVar19 = (float)(int)(fVar22 + fVar19 + -1.0 + 0.5);
      *(float *)((long)&(pIVar4->ClipRect).Min.x + lVar11) = fVar20;
      *(undefined4 *)((long)&(pIVar4->ClipRect).Min.y + lVar11) = 0xff7fffff;
      *(float *)((long)&(pIVar4->ClipRect).Max.x + lVar11) = fVar19;
      *(undefined4 *)((long)&(pIVar4->ClipRect).Max.y + lVar11) = 0x7f7fffff;
      IVar2 = (window->ClipRect).Min;
      fVar22 = IVar2.x;
      fVar21 = IVar2.y;
      uVar17 = -(uint)(fVar22 <= fVar20);
      uVar18 = -(uint)(fVar21 <= -3.4028235e+38);
      *(ulong *)((long)&(pIVar4->ClipRect).Min.x + lVar11) =
           CONCAT44(~uVar18 & (uint)fVar21,~uVar17 & (uint)fVar22) |
           CONCAT44(uVar18,(uint)fVar20 & uVar17) & 0xff7fffffffffffff;
      auVar24._8_8_ = 0;
      auVar24._0_4_ = (window->ClipRect).Max.x;
      auVar24._4_4_ = (window->ClipRect).Max.y;
      auVar23._4_12_ = auVar6._4_12_;
      auVar23._0_4_ = fVar19;
      auVar24 = minps(auVar23,auVar24);
      *(long *)((long)&(pIVar4->ClipRect).Max.x + lVar11) = auVar24._0_8_;
      lVar11 = lVar11 + 0x1c;
    } while ((ulong)(uint)columns_count * 0x1c != lVar11);
  }
  if (1 < pIVar8->Count) {
    ImDrawListSplitter::Split(&window->DrawList->_Splitter,window->DrawList,pIVar8->Count + 1);
    ImDrawListSplitter::SetCurrentChannel(&window->DrawList->_Splitter,window->DrawList,1);
    pIVar4 = (((GImGui->CurrentWindow->DC).CurrentColumns)->Columns).Data;
    PushClipRect(&(pIVar4->ClipRect).Min,&(pIVar4->ClipRect).Max,false);
  }
  iVar14 = pIVar8->Current;
  pIVar8 = (GImGui->CurrentWindow->DC).CurrentColumns;
  fVar20 = 0.0;
  fVar19 = 0.0;
  if (pIVar8 != (ImGuiColumns *)0x0) {
    iVar12 = iVar14;
    if (iVar14 < 0) {
      iVar12 = pIVar8->Current;
    }
    fVar19 = (pIVar8->OffMaxX - pIVar8->OffMinX) * (pIVar8->Columns).Data[iVar12].OffsetNorm +
             pIVar8->OffMinX;
  }
  if (pIVar8 != (ImGuiColumns *)0x0) {
    if (iVar14 < -1) {
      iVar14 = pIVar8->Current;
    }
    else {
      iVar14 = iVar14 + 1;
    }
    fVar20 = (pIVar8->OffMaxX - pIVar8->OffMinX) * (pIVar8->Columns).Data[iVar14].OffsetNorm +
             pIVar8->OffMinX;
  }
  PushItemWidth((fVar20 - fVar19) * 0.65);
  fVar22 = fVar1 - (window->WindowPadding).x;
  fVar22 = (float)(-(uint)(0.0 <= fVar22) & (uint)fVar22);
  (window->DC).ColumnsOffset.x = fVar22;
  fVar19 = (window->Pos).x;
  (window->DC).CursorPos.x = (float)(int)((window->DC).Indent.x + fVar19 + fVar22);
  (window->WorkRect).Max.x = (fVar20 + fVar19) - fVar1;
  return;
}

Assistant:

void ImGui::BeginColumns(const char* str_id, int columns_count, ImGuiColumnsFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(columns_count >= 1 && columns_count <= 64);   // Maximum 64 columns
    IM_ASSERT(window->DC.CurrentColumns == NULL);           // Nested columns are currently not supported

    // Acquire storage for the columns set
    ImGuiID id = GetColumnsID(str_id, columns_count);
    ImGuiColumns* columns = FindOrCreateColumns(window, id);
    IM_ASSERT(columns->ID == id);
    columns->Current = 0;
    columns->Count = columns_count;
    columns->Flags = flags;
    window->DC.CurrentColumns = columns;

    columns->HostCursorPosY = window->DC.CursorPos.y;
    columns->HostCursorMaxPosX = window->DC.CursorMaxPos.x;
    columns->HostClipRect = window->ClipRect;
    columns->HostWorkRect = window->WorkRect;

    // Set state for first column
    // We aim so that the right-most column will have the same clipping width as other after being clipped by parent ClipRect
    const float column_padding = g.Style.ItemSpacing.x;
    const float half_clip_extend_x = ImFloor(ImMax(window->WindowPadding.x * 0.5f, window->WindowBorderSize));
    const float max_1 = window->WorkRect.Max.x + column_padding - ImMax(column_padding - window->WindowPadding.x, 0.0f);
    const float max_2 = window->WorkRect.Max.x + half_clip_extend_x;
    columns->OffMinX = window->DC.Indent.x - column_padding + ImMax(column_padding - window->WindowPadding.x, 0.0f);
    columns->OffMaxX = ImMax(ImMin(max_1, max_2) - window->Pos.x, columns->OffMinX + 1.0f);
    columns->LineMinY = columns->LineMaxY = window->DC.CursorPos.y;

    // Clear data if columns count changed
    if (columns->Columns.Size != 0 && columns->Columns.Size != columns_count + 1)
        columns->Columns.resize(0);

    // Initialize default widths
    columns->IsFirstFrame = (columns->Columns.Size == 0);
    if (columns->Columns.Size == 0)
    {
        columns->Columns.reserve(columns_count + 1);
        for (int n = 0; n < columns_count + 1; n++)
        {
            ImGuiColumnData column;
            column.OffsetNorm = n / (float)columns_count;
            columns->Columns.push_back(column);
        }
    }

    for (int n = 0; n < columns_count; n++)
    {
        // Compute clipping rectangle
        ImGuiColumnData* column = &columns->Columns[n];
        float clip_x1 = IM_ROUND(window->Pos.x + GetColumnOffset(n));
        float clip_x2 = IM_ROUND(window->Pos.x + GetColumnOffset(n + 1) - 1.0f);
        column->ClipRect = ImRect(clip_x1, -FLT_MAX, clip_x2, +FLT_MAX);
        column->ClipRect.ClipWith(window->ClipRect);
    }

    if (columns->Count > 1)
    {
        window->DrawList->ChannelsSplit(1 + columns->Count);
        window->DrawList->ChannelsSetCurrent(1);
        PushColumnClipRect(0);
    }

    // We don't generally store Indent.x inside ColumnsOffset because it may be manipulated by the user.
    float offset_0 = GetColumnOffset(columns->Current);
    float offset_1 = GetColumnOffset(columns->Current + 1);
    float width = offset_1 - offset_0;
    PushItemWidth(width * 0.65f);
    window->DC.ColumnsOffset.x = ImMax(column_padding - window->WindowPadding.x, 0.0f);
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->WorkRect.Max.x = window->Pos.x + offset_1 - column_padding;
}